

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsEllipseItem::shape(QGraphicsEllipseItem *this)

{
  bool bVar1;
  QGraphicsEllipseItemPrivate *pQVar2;
  QPen *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsEllipseItemPrivate *d;
  QPainterPath path;
  QRectF *this_00;
  QRectF *path_00;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  path_00 = in_RDI;
  pQVar2 = d_func((QGraphicsEllipseItem *)0x9895d7);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&local_10);
  bVar1 = QRectF::isNull(&pQVar2->rect);
  if (bVar1) {
    QPainterPath::QPainterPath((QPainterPath *)in_RDI,(QPainterPath *)&local_10);
  }
  else {
    if (pQVar2->spanAngle == 0x1680) {
      QPainterPath::addEllipse((QRectF *)&local_10);
    }
    else {
      QRectF::center(this_00);
      QPainterPath::moveTo((QPointF *)&local_10);
      QPainterPath::arcTo((QRectF *)&local_10,(double)pQVar2->startAngle / 16.0,
                          (double)pQVar2->spanAngle / 16.0);
    }
    qt_graphicsItem_shapeFromPath((QPainterPath *)path_00,in_RSI);
  }
  QPainterPath::~QPainterPath((QPainterPath *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QPainterPath QGraphicsEllipseItem::shape() const
{
    Q_D(const QGraphicsEllipseItem);
    QPainterPath path;
    if (d->rect.isNull())
        return path;
    if (d->spanAngle != 360 * 16) {
        path.moveTo(d->rect.center());
        path.arcTo(d->rect, d->startAngle / 16.0, d->spanAngle / 16.0);
    } else {
        path.addEllipse(d->rect);
    }

    return qt_graphicsItem_shapeFromPath(path, d->pen);
}